

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraLcr.c
# Opt level: O2

Aig_Man_t * Fra_LcrCreatePart(Fra_Lcr_t *p,Vec_Int_t *vPart)

{
  int i;
  Aig_Man_t *pNew;
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  int i_00;
  
  pNew = Aig_ManStartFrom(p->pAig);
  Aig_ManIncrementTravId(p->pAig);
  pAVar1 = p->pAig->pConst1;
  pAVar1->TravId = p->pAig->nTravIds;
  pAVar1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  for (i_00 = 0; i_00 < vPart->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vPart,i_00);
    pAVar1 = Aig_ManCo(p->pAig,i);
    if ((pAVar1->field_0x18 & 0x10) == 0) {
      pAVar2 = pNew->pConst1;
    }
    else {
      pAVar2 = Fra_LcrCreatePart_rec
                         (p->pCla,pNew,p->pAig,
                          (Aig_Obj_t *)((ulong)pAVar1->pFanin0 & 0xfffffffffffffffe));
      pAVar2 = (Aig_Obj_t *)((ulong)((uint)pAVar1->pFanin0 & 1) ^ (ulong)pAVar2);
    }
    Aig_ObjCreateCo(pNew,pAVar2);
  }
  return pNew;
}

Assistant:

Aig_Man_t * Fra_LcrCreatePart( Fra_Lcr_t * p, Vec_Int_t * vPart )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int Out, i;
    // create new AIG for this partition
    pNew = Aig_ManStartFrom( p->pAig );
    Aig_ManIncrementTravId( p->pAig );
    Aig_ObjSetTravIdCurrent( p->pAig, Aig_ManConst1(p->pAig) );
    Aig_ManConst1(p->pAig)->pData = Aig_ManConst1(pNew);
    Vec_IntForEachEntry( vPart, Out, i )
    {
        pObj = Aig_ManCo( p->pAig, Out );
        if ( pObj->fMarkA )
        {
            pObjNew = Fra_LcrCreatePart_rec( p->pCla, pNew, p->pAig, Aig_ObjFanin0(pObj) );
            pObjNew = Aig_NotCond( pObjNew, Aig_ObjFaninC0(pObj) );
        }
        else
            pObjNew = Aig_ManConst1( pNew );
        Aig_ObjCreateCo( pNew, pObjNew ); 
    }
    return pNew;
}